

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O0

void embed_prepare_cb(ev_loop *loop,ev_prepare *prepare,int revents)

{
  ev_loop *loop_00;
  ev_loop *loop_1;
  ev_embed *w;
  int revents_local;
  ev_prepare *prepare_local;
  ev_loop *loop_local;
  
  loop_00 = *(ev_loop **)&prepare[-2].priority;
  while (loop_00->fdchangecnt != 0) {
    fd_reify(loop_00);
    ev_run(loop_00,1);
  }
  return;
}

Assistant:

static void
embed_prepare_cb (EV_P_ ev_prepare *prepare, int revents)
{
  ev_embed *w = (ev_embed *)(((char *)prepare) - offsetof (ev_embed, prepare));

  {
    EV_P = w->other;

    while (fdchangecnt)
      {
        fd_reify (EV_A);
        ev_run (EV_A_ EVRUN_NOWAIT);
      }
  }
}